

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::PizCompressor::compress
          (PizCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  bool bVar1;
  int iVar2;
  Channel *pCVar3;
  ulong uVar4;
  uchar *puVar5;
  unsigned_short *puVar6;
  long lVar7;
  undefined4 *in_RCX;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  int length;
  char *lengthPtr;
  int j;
  ChannelData *cd_3;
  int i_3;
  char *buf;
  unsigned_short maxValue;
  AutoArray<unsigned_short,_65536> lut;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  AutoArray<unsigned_char,_8192> bitmap;
  int n;
  ChannelData *cd_2;
  int i_2;
  int y_1;
  int x;
  ChannelData *cd_1;
  int i_1;
  int y;
  ChannelData *cd;
  ConstIterator c;
  int i;
  unsigned_short *tmpBufferEnd;
  int maxY;
  int minY;
  int maxX;
  int minX;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  unsigned_short in_stack_fffffffffffffe9e;
  int in_stack_fffffffffffffea0;
  PixelType in_stack_fffffffffffffea4;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined2 in_stack_ffffffffffffff1e;
  int in_stack_ffffffffffffff28;
  int iVar8;
  int iVar9;
  unsigned_short *puVar10;
  AutoArray local_c0 [28];
  ushort local_a4;
  ushort local_a2;
  AutoArray local_a0 [12];
  int local_94;
  long local_90;
  int local_84;
  int local_80;
  int local_7c;
  long local_78;
  int local_70;
  int local_6c;
  long *local_68;
  const_iterator local_60;
  const_iterator local_58;
  int local_4c;
  long local_48;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  void *local_18;
  int local_4;
  
  if (in_EDX == 0) {
    *in_R8 = *(undefined8 *)(in_RDI + 0x28);
    local_4 = 0;
  }
  else {
    local_34 = *in_RCX;
    local_38 = in_RCX[2];
    local_3c = in_RCX[1];
    local_40 = in_RCX[3];
    if (*(int *)(in_RDI + 0x50) < local_40) {
      local_40 = *(int *)(in_RDI + 0x50);
    }
    if (*(int *)(in_RDI + 0x4c) < local_38) {
      local_38 = *(int *)(in_RDI + 0x4c);
    }
    local_48 = *(long *)(in_RDI + 0x20);
    local_4c = 0;
    local_30 = in_R8;
    local_18 = in_RSI;
    local_58._M_node =
         (_Base_ptr)
         ChannelList::begin((ChannelList *)
                            CONCAT26(in_stack_fffffffffffffe9e,
                                     CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)))
    ;
    while( true ) {
      local_60._M_node =
           (_Base_ptr)
           ChannelList::end((ChannelList *)
                            CONCAT26(in_stack_fffffffffffffe9e,
                                     CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)))
      ;
      bVar1 = Imf_2_5::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                  (ConstIterator *)
                                  CONCAT26(in_stack_fffffffffffffe9e,
                                           CONCAT24(in_stack_fffffffffffffe9c,
                                                    in_stack_fffffffffffffe98)));
      if (!bVar1) break;
      local_68 = (long *)(*(long *)(in_RDI + 0x40) + (long)local_4c * 0x20);
      *local_68 = local_48;
      local_68[1] = *local_68;
      ChannelList::ConstIterator::channel((ConstIterator *)0xa58712);
      iVar2 = numSamples(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                         CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
      *(int *)(local_68 + 2) = iVar2;
      ChannelList::ConstIterator::channel((ConstIterator *)0xa58742);
      iVar2 = numSamples(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                         CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
      *(int *)((long)local_68 + 0x14) = iVar2;
      pCVar3 = ChannelList::ConstIterator::channel((ConstIterator *)0xa58772);
      *(int *)(local_68 + 3) = pCVar3->ySampling;
      ChannelList::ConstIterator::channel((ConstIterator *)0xa5878d);
      iVar2 = pixelTypeSize(in_stack_fffffffffffffea4);
      iVar8 = pixelTypeSize(in_stack_fffffffffffffea4);
      *(int *)((long)local_68 + 0x1c) = iVar2 / iVar8;
      local_48 = local_48 +
                 (long)((int)local_68[2] * *(int *)((long)local_68 + 0x14) *
                       *(int *)((long)local_68 + 0x1c)) * 2;
      ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      local_4c = local_4c + 1;
    }
    if (*(int *)(in_RDI + 0x14) == 1) {
      for (local_6c = local_3c; local_6c <= local_40; local_6c = local_6c + 1) {
        for (local_70 = 0; local_70 < *(int *)(in_RDI + 0x30); local_70 = local_70 + 1) {
          local_78 = *(long *)(in_RDI + 0x40) + (long)local_70 * 0x20;
          iVar2 = Imath_2_5::modp(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
          if (iVar2 == 0) {
            for (local_7c = *(int *)(local_78 + 0x10) * *(int *)(local_78 + 0x1c); 0 < local_7c;
                local_7c = local_7c + -1) {
              Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                        ((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (unsigned_short *)
                         CONCAT26(in_stack_fffffffffffffe9e,
                                  CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)));
              *(long *)(local_78 + 8) = *(long *)(local_78 + 8) + 2;
            }
          }
        }
      }
    }
    else {
      for (local_80 = local_3c; local_80 <= local_40; local_80 = local_80 + 1) {
        for (local_84 = 0; local_84 < *(int *)(in_RDI + 0x30); local_84 = local_84 + 1) {
          local_90 = *(long *)(in_RDI + 0x40) + (long)local_84 * 0x20;
          iVar2 = Imath_2_5::modp(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
          if (iVar2 == 0) {
            local_94 = *(int *)(local_90 + 0x10) * *(int *)(local_90 + 0x1c);
            memcpy(*(void **)(local_90 + 8),local_18,(long)local_94 << 1);
            local_18 = (void *)((long)local_94 * 2 + (long)local_18);
            *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + (long)local_94 * 2;
          }
        }
      }
    }
    AutoArray<unsigned_char,_8192>::AutoArray
              ((AutoArray<unsigned_char,_8192> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    puVar6 = *(unsigned_short **)(in_RDI + 0x20);
    uVar4 = local_48 - (long)puVar6;
    puVar5 = AutoArray::operator_cast_to_unsigned_char_(local_a0);
    anon_unknown_0::bitmapFromData(puVar6,(int)(uVar4 >> 1),puVar5,&local_a2,&local_a4);
    AutoArray<unsigned_short,_65536>::AutoArray
              ((AutoArray<unsigned_short,_65536> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    puVar5 = AutoArray::operator_cast_to_unsigned_char_(local_a0);
    puVar6 = AutoArray::operator_cast_to_unsigned_short_(local_c0);
    anon_unknown_0::forwardLutFromBitmap(puVar5,puVar6);
    puVar6 = AutoArray::operator_cast_to_unsigned_short_(local_c0);
    anon_unknown_0::applyLut
              (puVar6,*(unsigned_short **)(in_RDI + 0x20),
               (int)((ulong)(local_48 - (long)*(unsigned_short **)(in_RDI + 0x20)) >> 1));
    puVar6 = *(unsigned_short **)(in_RDI + 0x28);
    Xdr::write<Imf_2_5::CharPtrIO,char*>
              ((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9e);
    Xdr::write<Imf_2_5::CharPtrIO,char*>
              ((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9e);
    if (local_a2 <= local_a4) {
      AutoArray::operator_cast_to_unsigned_char_(local_a0);
      Xdr::write<Imf_2_5::CharPtrIO,char*>
                ((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (char *)CONCAT26(in_stack_fffffffffffffe9e,
                                  CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),0);
    }
    iVar2 = CONCAT22(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c);
    for (iVar8 = 0; iVar8 < *(int *)(in_RDI + 0x30); iVar8 = iVar8 + 1) {
      lVar7 = *(long *)(in_RDI + 0x40) + (long)iVar8 * 0x20;
      for (iVar2 = 0; iVar2 < *(int *)(lVar7 + 0x1c); iVar2 = iVar2 + 1) {
        wav2Encode(puVar6,iVar8,in_stack_ffffffffffffff28,(int)((ulong)lVar7 >> 0x20),(int)lVar7,
                   (unsigned_short)((uint)iVar2 >> 0x10));
      }
    }
    puVar10 = puVar6;
    Xdr::write<Imf_2_5::CharPtrIO,char*>
              ((char **)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
    iVar9 = (int)puVar10;
    iVar8 = hufCompress((unsigned_short *)
                        CONCAT26((short)((uint)iVar2 >> 0x10),
                                 CONCAT24((short)iVar2,in_stack_ffffffffffffff18)),
                        (int)((ulong)puVar6 >> 0x20),
                        (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    iVar2 = iVar8;
    Xdr::write<Imf_2_5::CharPtrIO,char*>
              ((char **)CONCAT44(iVar8,in_stack_fffffffffffffea0),
               CONCAT22(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c));
    *local_30 = *(undefined8 *)(in_RDI + 0x28);
    local_4 = (iVar9 - (int)*(undefined8 *)(in_RDI + 0x28)) + iVar2;
    AutoArray<unsigned_short,_65536>::~AutoArray
              ((AutoArray<unsigned_short,_65536> *)CONCAT44(iVar8,in_stack_fffffffffffffea0));
    AutoArray<unsigned_char,_8192>::~AutoArray
              ((AutoArray<unsigned_char,_8192> *)CONCAT44(iVar8,in_stack_fffffffffffffea0));
  }
  return local_4;
}

Assistant:

int
PizCompressor::compress (const char *inPtr,
			 int inSize,
			 IMATH_NAMESPACE::Box2i range,
			 const char *&outPtr)
{
    //
    // This is the compress function which is used by both the tiled and
    // scanline compression routines.
    //

    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Rearrange the pixel data so that the wavelet
    // and Huffman encoders can process them easily.
    //
    // The wavelet and Huffman encoders both handle only
    // 16-bit data, so 32-bit data must be split into smaller
    // pieces.  We treat each 32-bit channel (UINT, FLOAT) as
    // two interleaved 16-bit channels.
    //

    int minX = range.min.x;
    int maxX = range.max.x;
    int minY = range.min.y;
    int maxY = range.max.y;
    
    if (maxY > _maxY)
        maxY = _maxY;
    
    if (maxX > _maxX)
        maxX = _maxX;

    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);
	cd.ys = c.channel().ySampling;

	cd.size = pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    if (_format == XDR)
    {
	//
	// Machine-independent (Xdr) data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		for (int x = cd.nx * cd.size; x > 0; --x)
		{
		    Xdr::read <CharPtrIO> (inPtr, *cd.end);
		    ++cd.end;
		}
	    }
	}
    }
    else
    {
	//
	// Native, machine-dependent data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		inPtr  += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    //
    // Compress the range of the pixel data
    //

    AutoArray <unsigned char, BITMAP_SIZE> bitmap;
    unsigned short minNonZero;
    unsigned short maxNonZero;

    bitmapFromData (_tmpBuffer,
		    tmpBufferEnd - _tmpBuffer,
		    bitmap,
		    minNonZero, maxNonZero);

    AutoArray <unsigned short, USHORT_RANGE> lut;
    unsigned short maxValue = forwardLutFromBitmap (bitmap, lut);
    applyLut (lut, _tmpBuffer, tmpBufferEnd - _tmpBuffer);

    //
    // Store range compression info in _outBuffer
    //

    char *buf = _outBuffer;

    Xdr::write <CharPtrIO> (buf, minNonZero);
    Xdr::write <CharPtrIO> (buf, maxNonZero);

    if (minNonZero <= maxNonZero)
    {
	Xdr::write <CharPtrIO> (buf, (char *) &bitmap[0] + minNonZero,
				maxNonZero - minNonZero + 1);
    }

    //
    // Apply wavelet encoding
    //

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	for (int j = 0; j < cd.size; ++j)
	{
	    wav2Encode (cd.start + j,
			cd.nx, cd.size,
			cd.ny, cd.nx * cd.size,
			maxValue);
	}
    }

    //
    // Apply Huffman encoding; append the result to _outBuffer
    //

    char *lengthPtr = buf;
    Xdr::write <CharPtrIO> (buf, int(0));

    int length = hufCompress (_tmpBuffer, tmpBufferEnd - _tmpBuffer, buf);
    Xdr::write <CharPtrIO> (lengthPtr, length);

    outPtr = _outBuffer;
    return buf - _outBuffer + length;
}